

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_surface.cxx
# Opt level: O2

void __thiscall xray_re::xr_surface::xr_surface(xr_surface *this,bool skeletal)

{
  undefined7 in_register_00000031;
  char *pcVar1;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  
  this->_vptr_xr_surface = (_func_int **)&PTR__xr_surface_0023a3b0;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  pcVar1 = "default";
  if ((int)CONCAT71(in_register_00000031,skeletal) != 0) {
    pcVar1 = "models\\model";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_eshader,pcVar1,&local_31);
  pcVar1 = "default";
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_cshader,"default",&local_32)
  ;
  if (skeletal) {
    pcVar1 = "default_object";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_gamemtl,pcVar1,&local_33);
  (this->m_texture)._M_dataplus._M_p = (pointer)&(this->m_texture).field_2;
  (this->m_texture)._M_string_length = 0;
  (this->m_texture).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_vmap,"Texture",&local_34);
  this->m_flags = 0;
  this->m_fvf = 0x112;
  return;
}

Assistant:

xr_surface::xr_surface(bool skeletal):
	m_eshader(skeletal ? "models\\model" : "default"),
	m_cshader("default"),
	m_gamemtl(skeletal ? "default_object" : "default"),
	m_vmap("Texture"),
	m_flags(0),
	m_fvf(ESURFACE_DEFAULT_FVF) {}